

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

CoinsList * __thiscall
wallet::anon_unknown_5::WalletImpl::listCoins(CoinsList *__return_storage_ptr__,WalletImpl *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  CWallet *this_00;
  vector<std::tuple<COutPoint,interfaces::WalletTxOut>,std::allocator<std::tuple<COutPoint,interfaces::WalletTxOut>>>
  *this_01;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock29;
  WalletTxOut result;
  unique_lock<std::recursive_mutex> local_b0;
  WalletTxOut local_a0;
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_b0,
             &((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->cs_wallet,"m_wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/interfaces.cpp"
             ,0x1d8,false);
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  ListCoins(&local_68,
            (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  for (p_Var3 = local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_68._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    this_01 = (vector<std::tuple<COutPoint,interfaces::WalletTxOut>,std::allocator<std::tuple<COutPoint,interfaces::WalletTxOut>>>
               *)_GLOBAL__N_1::std::
                 map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<std::tuple<COutPoint,_interfaces::WalletTxOut>,_std::allocator<std::tuple<COutPoint,_interfaces::WalletTxOut>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<std::tuple<COutPoint,_interfaces::WalletTxOut>,_std::allocator<std::tuple<COutPoint,_interfaces::WalletTxOut>_>_>_>_>_>
                 ::operator[](__return_storage_ptr__,(key_type *)(p_Var3 + 1));
    p_Var2 = p_Var3[3]._M_right;
    for (p_Var4 = p_Var3[3]._M_left; p_Var4 != p_Var2; p_Var4 = p_Var4 + 5) {
      this_00 = (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      interfaces::WalletTxOut::WalletTxOut(&local_a0);
      CTxOut::operator=(&local_a0.txout,(CTxOut *)&p_Var4[2]._M_parent);
      local_a0.time = *(int64_t *)(p_Var4 + 4);
      local_a0.depth_in_main_chain = *(int *)&p_Var4[3]._M_left;
      local_a0.is_spent = CWallet::IsSpent(this_00,(COutPoint *)(p_Var4 + 1));
      std::
      vector<std::tuple<COutPoint,interfaces::WalletTxOut>,std::allocator<std::tuple<COutPoint,interfaces::WalletTxOut>>>
      ::emplace_back<COutPoint_const&,interfaces::WalletTxOut>
                (this_01,(COutPoint *)(p_Var4 + 1),&local_a0);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                (&local_a0.txout.scriptPubKey.super_CScriptBase);
    }
  }
  _GLOBAL__N_1::std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&local_68);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CoinsList listCoins() override
    {
        LOCK(m_wallet->cs_wallet);
        CoinsList result;
        for (const auto& entry : ListCoins(*m_wallet)) {
            auto& group = result[entry.first];
            for (const auto& coin : entry.second) {
                group.emplace_back(coin.outpoint,
                    MakeWalletTxOut(*m_wallet, coin));
            }
        }
        return result;
    }